

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O1

int FinalizeSkipProba(VP8Encoder *enc)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar4 = (long)enc->mb_h * (long)enc->mb_w;
  iVar1 = (enc->proba).nb_skip;
  if ((int)uVar4 == 0) {
    uVar2 = 0xff;
  }
  else {
    uVar2 = (uint)(((uVar4 - (long)iVar1) * 0xff) / uVar4);
  }
  (enc->proba).skip_proba = (byte)uVar2;
  iVar3 = 0x100;
  bVar5 = (uVar2 & 0xfe) < 0xfa;
  (enc->proba).use_skip_proba = (uint)bVar5;
  if (bVar5) {
    iVar3 = (uint)VP8EntropyCost[(byte)~(byte)uVar2] * iVar1 +
            (uint)VP8EntropyCost[uVar2 & 0xff] * ((int)uVar4 - iVar1) + 0x900;
  }
  return iVar3;
}

Assistant:

static int FinalizeSkipProba(VP8Encoder* const enc) {
  VP8EncProba* const proba = &enc->proba;
  const int nb_mbs = enc->mb_w * enc->mb_h;
  const int nb_events = proba->nb_skip;
  int size;
  proba->skip_proba = CalcSkipProba(nb_events, nb_mbs);
  proba->use_skip_proba = (proba->skip_proba < SKIP_PROBA_THRESHOLD);
  size = 256;   // 'use_skip_proba' bit
  if (proba->use_skip_proba) {
    size +=  nb_events * VP8BitCost(1, proba->skip_proba)
         + (nb_mbs - nb_events) * VP8BitCost(0, proba->skip_proba);
    size += 8 * 256;   // cost of signaling the 'skip_proba' itself.
  }
  return size;
}